

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobj.cpp
# Opt level: O2

void test_receive_proc(Am_Connection *my_connection_ptr)

{
  ostream *poVar1;
  ulong uVar2;
  Am_Object sent_obj;
  Am_Value val;
  
  Am_Connection::Receive();
  poVar1 = std::operator<<((ostream *)&std::cout,"testnobj:Received ");
  poVar1 = (ostream *)operator<<(poVar1,&val);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  Am_Object::Am_Object(&sent_obj,&val);
  uVar2 = Am_Object::Get((ushort)&sent_obj,0x65);
  Am_Object::Set(0x5218,(Am_Value *)0x65,uVar2);
  uVar2 = Am_Object::Get((ushort)&sent_obj,100);
  Am_Object::Set(0x5218,(Am_Value *)0x64,uVar2);
  Am_Object::~Am_Object(&sent_obj);
  Am_Value::~Am_Value(&val);
  return;
}

Assistant:

Am_Define_Method(Am_Receive_Method, void, test_receive,
                 (Am_Connection * my_connection_ptr))
{
  Am_Value val = my_connection_ptr->Receive();
  cout << "testnobj:Received " << val << endl << flush;

  Am_Object sent_obj = (Am_Object)val;
  rectangle.Set(Am_TOP, sent_obj.Get(Am_TOP));
  rectangle.Set(Am_LEFT, sent_obj.Get(Am_LEFT));
}